

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derDecDeep(octet *der,size_t count,size_t deep)

{
  bool_t bVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  size_t len;
  u32 local_38;
  u32 tag;
  
  uVar3 = 0xffffffffffffffff;
  if ((deep < 0x21) &&
     (sVar2 = derTLDec(&tag,&len,der,count), sVar4 = len, sVar2 != 0xffffffffffffffff)) {
    uVar3 = sVar2 + len;
    if (count < uVar3) {
LAB_001180b7:
      uVar3 = 0xffffffffffffffff;
    }
    else {
      local_38 = tag;
      bVar1 = derTIsPrimitive(tag);
      if (bVar1 == 0) {
        while (uVar3 = sVar2, sVar4 != 0) {
          sVar4 = derDecDeep(der + sVar2,sVar4,deep + 1);
          if (sVar4 == 0xffffffffffffffff) goto LAB_001180b7;
          sVar2 = sVar2 + sVar4;
          sVar4 = len - sVar4;
          len = sVar4;
        }
      }
      else if (local_38 == 0x13) {
        uVar3 = derTPSTRDec((char *)0x0,&len,der,count,0x13);
      }
      else if (local_38 == 5) {
        uVar3 = derDec4(der,count,5,(void *)0x0,0);
      }
      else if (local_38 == 6) {
        uVar3 = derOIDDec((char *)0x0,&len,der,count);
      }
      else if (local_38 == 3) {
        uVar3 = derTBITDec((octet *)0x0,&len,der,count,3);
      }
    }
  }
  return uVar3;
}

Assistant:

static size_t derDecDeep(const octet der[], size_t count, size_t deep)
{
	u32 tag;
	size_t len;
	size_t c;
	// превышена глубина вложенности?
	if (deep > 32)
		return SIZE_MAX;
	// обработать TL
	c = derTLDec(&tag, &len, der, count);
	if (c == SIZE_MAX || c + len > count)
		return SIZE_MAX;
	// примитивный код?
	if (derTIsPrimitive(tag))
	{
		if (tag == 0x03)
			return derBITDec(0, &len, der, count);
		if (tag == 0x05)
			return derNULLDec(der, count);
		if (tag == 0x06)
			return derOIDDec(0, &len, der, count);
		if (tag == 0x13)
			return derPSTRDec(0, &len, der, count);
		return c + len;
	}
	// конструктивный код
	while (len)
	{
		size_t c1;
		c1 = derDecDeep(der + c, len, deep + 1);
		if (c1 == SIZE_MAX)
			return SIZE_MAX;
		c += c1, len -= c1;
	}
	return c;
}